

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_internal.h
# Opt level: O2

void http_s_destroy(http_s *h,uint8_t log)

{
  undefined3 in_register_00000031;
  
  if (((CONCAT31(in_register_00000031,log) != 0) && (h->status != 0)) && (h->status_str == 0)) {
    http_write_log(h);
  }
  fiobj_free(h->method);
  fiobj_free(h->status_str);
  fiobj_free((h->private_data).out_headers);
  fiobj_free(h->headers);
  fiobj_free(h->version);
  fiobj_free(h->query);
  fiobj_free(h->path);
  fiobj_free(h->cookies);
  fiobj_free(h->body);
  fiobj_free(h->params);
  h->body = 0;
  h->udata = (void *)0x0;
  h->cookies = 0;
  h->params = 0;
  h->query = 0;
  h->headers = 0;
  h->status = 0;
  h->path = 0;
  h->status_str = 0;
  h->version = 0;
  (h->received_at).tv_nsec = 0;
  h->method = 0;
  (h->private_data).out_headers = 0;
  (h->received_at).tv_sec = 0;
  return;
}

Assistant:

static inline void http_s_destroy(http_s *h, uint8_t log) {
  if (log && h->status && !h->status_str) {
    http_write_log(h);
  }
  fiobj_free(h->method);
  fiobj_free(h->status_str);
  fiobj_free(h->private_data.out_headers);
  fiobj_free(h->headers);
  fiobj_free(h->version);
  fiobj_free(h->query);
  fiobj_free(h->path);
  fiobj_free(h->cookies);
  fiobj_free(h->body);
  fiobj_free(h->params);

  *h = (http_s){
      .private_data.vtbl = h->private_data.vtbl,
      .private_data.flag = h->private_data.flag,
  };
}